

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O0

char ** RDL_calculate_pairwise_family
                  (char **cycle_array,uint nof_rings,uint nof_bonds,_func_int_void_ptr *stop)

{
  char *bitset;
  char *bitset_00;
  char *bitset_01;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  char **current_rings;
  bool bVar6;
  double dVar7;
  size_t matrix_size;
  uint local_80;
  uint ring_count;
  uint ridx;
  uint ringcounter;
  uint intersection_count;
  uint ring2_count;
  uint ring1_count;
  uint k;
  uint j;
  uint i;
  char *ring;
  char *ring2;
  char *ring1;
  char **rings;
  char **ring_sets;
  char **family_relation;
  char *family_relation_data;
  _func_int_void_ptr *stop_local;
  uint nof_bonds_local;
  uint nof_rings_local;
  char **cycle_array_local;
  
  dVar7 = sqrt(4294967295.0);
  if ((double)nof_rings < dVar7 - 1.0) {
    pvVar4 = malloc((ulong)nof_rings * (ulong)nof_rings);
    if (pvVar4 == (void *)0x0) {
      cycle_array_local = (char **)0x0;
    }
    else {
      memset(pvVar4,0,(ulong)nof_rings * (ulong)nof_rings);
      cycle_array_local = (char **)malloc((ulong)nof_rings << 3);
      for (k = 0; k < nof_rings; k = k + 1) {
        cycle_array_local[k] = (char *)((long)pvVar4 + (ulong)(k * nof_rings));
      }
      pvVar4 = malloc((ulong)nof_rings << 3);
      for (k = 0; k < nof_rings; k = k + 1) {
        pvVar5 = malloc((ulong)nof_bonds);
        *(void **)((long)pvVar4 + (ulong)k * 8) = pvVar5;
        memcpy(*(void **)((long)pvVar4 + (ulong)k * 8),cycle_array[k],(ulong)nof_bonds);
      }
      current_rings = (char **)malloc((ulong)nof_rings << 3);
      k = 0;
      while( true ) {
        bVar6 = false;
        if (k < nof_rings) {
          iVar1 = (*stop)((void *)0x0);
          bVar6 = iVar1 == 0;
        }
        ring1_count = k;
        if (!bVar6) break;
        while( true ) {
          ring1_count = ring1_count + 1;
          bVar6 = false;
          if (ring1_count < nof_rings) {
            iVar1 = (*stop)((void *)0x0);
            bVar6 = iVar1 == 0;
          }
          if (!bVar6) break;
          bitset = *(char **)((long)pvVar4 + (ulong)k * 8);
          bitset_00 = *(char **)((long)pvVar4 + (ulong)ring1_count * 8);
          uVar2 = RDL_count_bonds(bitset,nof_bonds);
          uVar3 = RDL_count_bonds(bitset_00,nof_bonds);
          if (uVar2 == uVar3) {
            ridx = 0;
            for (ring2_count = 0; ring2_count < nof_bonds; ring2_count = ring2_count + 1) {
              if ((bitset[ring2_count] != '\0') && (bitset_00[ring2_count] != '\0')) {
                ridx = ridx + 1;
              }
            }
            if (ridx != 0) {
              ring_count = 0;
              for (local_80 = 0; local_80 < nof_rings; local_80 = local_80 + 1) {
                bitset_01 = *(char **)((long)pvVar4 + (ulong)local_80 * 8);
                uVar3 = RDL_count_bonds(bitset_01,nof_bonds);
                if (uVar3 < uVar2) {
                  current_rings[ring_count] = bitset_01;
                  ring_count = ring_count + 1;
                }
              }
              iVar1 = RDL_check_property3(bitset,nof_bonds,bitset_00,current_rings,ring_count,0,stop
                                         );
              cycle_array_local[k][ring1_count] = (char)iVar1;
              cycle_array_local[ring1_count][k] = cycle_array_local[k][ring1_count];
            }
          }
        }
        k = k + 1;
      }
      for (k = 0; k < nof_rings; k = k + 1) {
        free(*(void **)((long)pvVar4 + (ulong)k * 8));
      }
      free(pvVar4);
      free(current_rings);
    }
  }
  else {
    cycle_array_local = (char **)0x0;
  }
  return cycle_array_local;
}

Assistant:

char** RDL_calculate_pairwise_family(const char** cycle_array,
                                  unsigned nof_rings,
                                  unsigned nof_bonds,
                                  int (*stop) (const void*))
{
  char* family_relation_data;
  char **family_relation, **ring_sets;
  const char **rings;
  const char *ring1, *ring2, *ring;
  unsigned i, j, k, ring1_count, ring2_count, intersection_count,
    ringcounter, ridx, ring_count;

  size_t matrix_size = nof_rings;

  if (nof_rings >= sqrt(UINT_MAX) - 1) {
    return NULL;
  }

  matrix_size *= nof_rings;

  /* first establish pairwise URF-relations */
  family_relation_data = malloc(matrix_size * sizeof(*family_relation_data));

  /* too much memory requested */
  if (!family_relation_data) {
    return NULL;
  }

  memset(family_relation_data, 0, matrix_size * sizeof(*family_relation_data));
  family_relation = malloc(nof_rings * sizeof(*family_relation));

  for (i = 0; i < nof_rings; ++i) {
    family_relation[i] = family_relation_data + i * nof_rings;
  }

  ring_sets = malloc(nof_rings * sizeof(*ring_sets));

  for (i = 0; i < nof_rings; ++i) {
    ring_sets[i] = malloc(nof_bonds * sizeof(**ring_sets));
    memcpy(ring_sets[i], cycle_array[i], nof_bonds);
  }

  rings = malloc(nof_rings * sizeof(*rings));

  for (i = 0; i < nof_rings && !stop(NULL); ++i) {
    for (j = i+1; j < nof_rings && !stop(NULL); ++j) {
      ring1 = ring_sets[i];
      ring2 = ring_sets[j];
      /* check property 1: |C1| == |C2| */
      ring1_count = RDL_count_bonds(ring1, nof_bonds);
      ring2_count = RDL_count_bonds(ring2, nof_bonds);
      if (ring1_count != ring2_count) {
        continue;
      }
      /* check property 2: C1 ^ C2 != o */
      intersection_count = 0;
      for (k = 0; k < nof_bonds; ++k) {
        if (ring1[k] && ring2[k]) {
          ++intersection_count;
        }
      }
      if (intersection_count == 0) {
        continue;
      }

      /*
       * check property 3: exists any subset of strictly smaller rings,
       * so the symmetric difference of ring 1 and a subset of
       * those smaller rings equals ring 2
       */
      ringcounter = 0;
      for(ridx = 0; ridx < nof_rings; ++ridx) {
        ring = ring_sets[ridx];
        ring_count = RDL_count_bonds(ring, nof_bonds);
        if (ring_count < ring1_count) {
          rings[ringcounter] = ring;
          ++ringcounter;
        }
      }

      family_relation[i][j] = RDL_check_property3(
          ring1, nof_bonds, ring2, rings, ringcounter, 0, stop);
      family_relation[j][i] = family_relation[i][j];
    }
  }

  for (i = 0; i < nof_rings; ++i) {
    free(ring_sets[i]);
  }

  free(ring_sets);
  free((void*)rings);

  return family_relation;
}